

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode Curl_auth_decode_ntlm_type2_message(Curl_easy *data,bufref *type2ref,ntlmdata *ntlm)

{
  uint uVar1;
  long *plVar2;
  size_t sVar3;
  size_t type2len;
  uchar *type2;
  CURLcode result;
  ntlmdata *ntlm_local;
  bufref *type2ref_local;
  Curl_easy *data_local;
  
  type2._4_4_ = CURLE_OK;
  plVar2 = (long *)Curl_bufref_ptr(type2ref);
  sVar3 = Curl_bufref_len(type2ref);
  ntlm->flags = 0;
  if (((sVar3 < 0x20) || (*plVar2 != 0x5053534d4c544e)) || ((int)plVar2[1] != 2)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"NTLM handshake failure (bad type-2 message)");
    }
    data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    uVar1 = Curl_read32_le((uchar *)((long)plVar2 + 0x14));
    ntlm->flags = uVar1;
    *(long *)ntlm->nonce = plVar2[3];
    if (((ntlm->flags & 0x800000) == 0) ||
       (type2._4_4_ = ntlm_decode_type2_target(data,type2ref,ntlm), type2._4_4_ == CURLE_OK)) {
      data_local._4_4_ = type2._4_4_;
    }
    else {
      data_local._4_4_ = type2._4_4_;
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"NTLM handshake failure (bad type-2 message)");
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_decode_ntlm_type2_message(struct Curl_easy *data,
                                             const struct bufref *type2ref,
                                             struct ntlmdata *ntlm)
{
  static const char type2_marker[] = { 0x02, 0x00, 0x00, 0x00 };

  /* NTLM type-2 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x02000000)
           12    Target Name            security buffer
           20    Flags                  long
           24    Challenge              8 bytes
          (32)   Context                8 bytes (two consecutive longs) (*)
          (40)   Target Information     security buffer (*)
          (48)   OS Version Structure   8 bytes (*)
  32 (48) (56)   Start of data block    (*)
                                        (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  const unsigned char *type2 = Curl_bufref_ptr(type2ref);
  size_t type2len = Curl_bufref_len(type2ref);

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)data;
#endif

  ntlm->flags = 0;

  if((type2len < 32) ||
     (memcmp(type2, NTLMSSP_SIGNATURE, 8) != 0) ||
     (memcmp(type2 + 8, type2_marker, sizeof(type2_marker)) != 0)) {
    /* This was not a good enough type-2 message */
    infof(data, "NTLM handshake failure (bad type-2 message)");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = Curl_read32_le(&type2[20]);
  memcpy(ntlm->nonce, &type2[24], 8);

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_TARGET_INFO) {
    result = ntlm_decode_type2_target(data, type2ref, ntlm);
    if(result) {
      infof(data, "NTLM handshake failure (bad type-2 message)");
      return result;
    }
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE2 header flags=0x%08.8lx ", ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n                  nonce=");
    ntlm_print_hex(stderr, (char *)ntlm->nonce, 8);
    fprintf(stderr, "\n****\n");
    fprintf(stderr, "**** Header %s\n ", header);
  });

  return result;
}